

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O3

void __thiscall helics::TimeoutMonitor::tick(TimeoutMonitor *this,CoreBroker *brk)

{
  int iVar1;
  long lVar2;
  pointer plVar3;
  string_view message;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  linkConnection *conn;
  pointer plVar9;
  string_view name;
  ActionMessage png;
  ActionMessage local_e8;
  
  bVar8 = (this->parentConnection).waitingForPingReply;
  lVar5 = std::chrono::_V2::steady_clock::now();
  if ((((brk->super_BrokerBase).field_0x293 & 1) == 0) &&
     ((this->parentConnection).waitingForPingReply == true)) {
    lVar6 = lVar5 - (this->parentConnection).lastPing.__d.__r;
    lVar2 = (this->timeout).__r;
    lVar7 = lVar2 * 1000000;
    if (lVar6 == lVar7 || SBORROW8(lVar6,lVar7) != lVar6 + lVar2 * -1000000 < 0) {
      ActionMessage::ActionMessage(&local_e8,cmd_ping_priority);
      local_e8.source_id.gid = (brk->super_BrokerBase).global_broker_id_local.gid;
      local_e8.dest_id.gid = (brk->super_BrokerBase).higher_broker_id.gid;
      (*(brk->super_Broker)._vptr_Broker[0x22])(brk,0,&local_e8);
      ActionMessage::~ActionMessage(&local_e8);
    }
    else {
      message._M_str = "broker lost connection with parent";
      message._M_len = 0x22;
      name._M_str = (brk->super_BrokerBase).identifier._M_dataplus._M_p;
      name._M_len = (brk->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger
                (&brk->super_BrokerBase,
                 (GlobalFederateId)(brk->super_BrokerBase).global_broker_id_local.gid,0,name,message
                 ,false);
      CoreBroker::sendErrorToImmediateBrokers(brk,-5);
      CoreBroker::sendDisconnect(brk,cmd_global_disconnect);
      LOCK();
      (brk->super_BrokerBase).brokerState._M_i = ERRORED;
      UNLOCK();
      ActionMessage::ActionMessage(&local_e8,cmd_stop);
      BrokerBase::addActionMessage(&brk->super_BrokerBase,&local_e8);
      ActionMessage::~ActionMessage(&local_e8);
    }
  }
  plVar9 = (this->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
           _M_impl.super__Vector_impl_data._M_start;
  plVar3 = (this->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (plVar9 != plVar3) {
    do {
      if (plVar9->waitingForPingReply == true) {
        lVar6 = lVar5 - (plVar9->lastPing).__d.__r;
        lVar2 = (this->timeout).__r;
        lVar7 = lVar2 * 1000000;
        if (lVar6 == lVar7 || SBORROW8(lVar6,lVar7) != lVar6 + lVar2 * -1000000 < 0) {
          ActionMessage::ActionMessage(&local_e8,cmd_ping);
          local_e8.source_id.gid = (brk->super_BrokerBase).global_broker_id_local.gid;
          local_e8.dest_id.gid = (plVar9->connection).gid;
          BrokerBase::addActionMessage(&brk->super_BrokerBase,&local_e8);
        }
        else {
          ActionMessage::ActionMessage(&local_e8,cmd_connection_error);
          local_e8.dest_id.gid = (brk->super_BrokerBase).global_broker_id_local.gid;
          local_e8.source_id.gid = (plVar9->connection).gid;
          BrokerBase::addActionMessage(&brk->super_BrokerBase,&local_e8);
        }
        ActionMessage::~ActionMessage(&local_e8);
        bVar8 = 1;
      }
      plVar9 = plVar9 + 1;
    } while (plVar9 != plVar3);
  }
  if ((bVar8 & 1) != 0) {
    return;
  }
  if (((brk->super_BrokerBase).field_0x293 & 1) != 0) {
    pingSub(this,brk);
    return;
  }
  bVar4 = CoreBroker::isConnected(brk);
  if ((((bVar4) &&
       (iVar1 = (brk->super_BrokerBase).global_broker_id_local.gid, iVar1 != -2010000000)) &&
      (iVar1 != -1700000000)) && (iVar1 != 0)) {
    iVar1 = (brk->super_BrokerBase).higher_broker_id.gid;
    if (iVar1 == -2010000000) {
      return;
    }
    if (iVar1 == -1700000000) {
      return;
    }
    ActionMessage::ActionMessage(&local_e8,cmd_ping_priority);
    local_e8.source_id.gid = (brk->super_BrokerBase).global_broker_id_local.gid;
    local_e8.dest_id.gid = (brk->super_BrokerBase).higher_broker_id.gid;
    (*(brk->super_Broker)._vptr_Broker[0x22])(brk,0,&local_e8);
    (this->parentConnection).lastPing.__d.__r = lVar5;
    (this->parentConnection).waitingForPingReply = true;
  }
  else if (((brk->super_BrokerBase).brokerState._M_i == TERMINATED) ||
          ((brk->super_BrokerBase).brokerState._M_i == ERRORED)) {
    if (this->waitingForConnection != true) goto LAB_00314af3;
    lVar5 = lVar5 - (this->startWaiting).__d.__r;
    lVar2 = (this->timeout).__r;
    lVar6 = lVar2 * 1000000;
    if (lVar5 == lVar6 || SBORROW8(lVar5,lVar6) != lVar5 + lVar2 * -1000000 < 0) {
      return;
    }
    ActionMessage::ActionMessage(&local_e8,cmd_check_connections);
    local_e8.source_id.gid = (brk->super_BrokerBase).global_broker_id_local.gid;
    BrokerBase::addActionMessage(&brk->super_BrokerBase,&local_e8);
  }
  else {
    if (this->waitingForConnection != true) {
LAB_00314af3:
      this->waitingForConnection = true;
      (this->startWaiting).__d.__r = lVar5;
      return;
    }
    lVar5 = lVar5 - (this->startWaiting).__d.__r;
    lVar2 = (this->timeout).__r;
    lVar6 = lVar2 * 1000000;
    if (lVar5 == lVar6 || SBORROW8(lVar5,lVar6) != lVar5 + lVar2 * -1000000 < 0) {
      return;
    }
    ActionMessage::ActionMessage(&local_e8,cmd_check_connections);
    local_e8.source_id.gid = (brk->super_BrokerBase).global_broker_id_local.gid;
    BrokerBase::addActionMessage(&brk->super_BrokerBase,&local_e8);
  }
  ActionMessage::~ActionMessage(&local_e8);
  return;
}

Assistant:

void TimeoutMonitor::tick(CoreBroker* brk)
{
    // check the connections

    bool waiting = parentConnection.waitingForPingReply;
    auto now = std::chrono::steady_clock::now();

    if (!brk->isRoot() && parentConnection.waitingForPingReply) {
        if (now - parentConnection.lastPing > timeout) {
            // try to reset the connection to the broker
            // brokerReconnect()
            brk->sendToLogger(brk->global_broker_id_local,
                              LogLevels::ERROR_LEVEL,
                              brk->getIdentifier(),
                              "broker lost connection with parent");
            brk->sendErrorToImmediateBrokers(-5);
            brk->sendDisconnect(CMD_GLOBAL_DISCONNECT);
            brk->brokerState = BrokerBase::BrokerState::ERRORED;
            brk->addActionMessage(CMD_STOP);
        } else {  // ping again
            ActionMessage png(CMD_PING_PRIORITY);
            png.source_id = brk->global_broker_id_local;
            png.dest_id = brk->higher_broker_id;
            brk->transmit(parent_route_id, png);
        }
    }

    for (auto& conn : connections) {
        if (conn.waitingForPingReply) {
            waiting = true;
            if (now - conn.lastPing > timeout) {
                ActionMessage cerror(CMD_CONNECTION_ERROR);
                cerror.dest_id = brk->global_broker_id_local;
                cerror.source_id = conn.connection;
                brk->addActionMessage(cerror);
            } else {  // ping again
                ActionMessage png(CMD_PING);
                png.source_id = brk->global_broker_id_local;
                png.dest_id = conn.connection;
                brk->addActionMessage(png);
            }
        }
    }
    if (!waiting) {
        if (!brk->isRoot()) {
            if ((brk->isConnected()) && (brk->global_broker_id_local.isValid()) &&
                (brk->global_broker_id_local != parent_broker_id)) {
                // if (allFedWaiting())
                //{
                if (brk->higher_broker_id.isValid()) {
                    ActionMessage png(CMD_PING_PRIORITY);
                    png.source_id = brk->global_broker_id_local;
                    png.dest_id = brk->higher_broker_id;
                    brk->transmit(parent_route_id, png);
                    parentConnection.lastPing = now;
                    parentConnection.waitingForPingReply = true;
                }
                //}
            } else if ((brk->brokerState == BrokerBase::BrokerState::TERMINATED) ||
                       (brk->brokerState == BrokerBase::BrokerState::ERRORED)) {
                if (waitingForConnection) {
                    if (now - startWaiting > timeout) {
                        ActionMessage png(CMD_CHECK_CONNECTIONS);
                        png.source_id = brk->global_broker_id_local;
                        brk->addActionMessage(png);
                    }
                } else {
                    waitingForConnection = true;
                    startWaiting = now;
                }
            } else {
                if (waitingForConnection) {
                    if (now - startWaiting > timeout) {
                        ActionMessage png(CMD_CHECK_CONNECTIONS);
                        png.source_id = brk->global_broker_id_local;
                        brk->addActionMessage(png);
                    }
                } else {
                    waitingForConnection = true;
                    startWaiting = now;
                }
            }
        } else {  // brk is a root broker
            pingSub(brk);
        }
    }
}